

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

string * __thiscall Ratio::toStringCombType_abi_cxx11_(string *__return_storage_ptr__,Ratio *this)

{
  pointer pPVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,"{");
  lVar4 = 0;
  for (uVar3 = 0;
      pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->eEdges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48);
      uVar3 = uVar3 + 1) {
    iVar2 = PhyloTreeEdge::getOriginalID
                      ((PhyloTreeEdge *)
                       ((long)&(pPVar1->super_Bipartition)._vptr_Bipartition + lVar4));
    std::ostream::operator<<((ostream *)&ss,iVar2);
    if (uVar3 < ((long)(this->eEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->eEdges).
                      super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x48 - 1U) {
      std::operator<<((ostream *)&ss,",");
    }
    lVar4 = lVar4 + 0x48;
  }
  std::operator<<((ostream *)&ss,"}/{");
  lVar4 = 0;
  for (uVar3 = 0;
      pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->fEdges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48);
      uVar3 = uVar3 + 1) {
    iVar2 = PhyloTreeEdge::getOriginalID
                      ((PhyloTreeEdge *)
                       ((long)&(pPVar1->super_Bipartition)._vptr_Bipartition + lVar4));
    std::ostream::operator<<((ostream *)&ss,iVar2);
    if (uVar3 < ((long)(this->fEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->fEdges).
                      super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x48 - 1U) {
      std::operator<<((ostream *)&ss,",");
    }
    lVar4 = lVar4 + 0x48;
  }
  std::operator<<((ostream *)&ss,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toStringCombType() {
    ostringstream ss;
    ss << "{";

    for (size_t i = 0; i < eEdges.size(); i++) {
        ss << eEdges[i].getOriginalID();
        if (i < eEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}/{";

    for (size_t i = 0; i < fEdges.size(); i++) {
        ss << fEdges[i].getOriginalID();
        if (i < fEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}